

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

int Aig_ObjCollectSuper(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  ulong *puVar1;
  int iVar2;
  long lVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x44c,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    vSuper->nSize = 0;
    iVar2 = Aig_ObjCollectSuper_rec(pObj,pObj,vSuper);
    if (1 < vSuper->nSize) {
      if (0 < vSuper->nSize) {
        lVar3 = 0;
        do {
          puVar1 = (ulong *)(((ulong)vSuper->pArray[lVar3] & 0xfffffffffffffffe) + 0x18);
          *puVar1 = *puVar1 & 0xffffffffffffffef;
          lVar3 = lVar3 + 1;
        } while (lVar3 < vSuper->nSize);
      }
      if (iVar2 == -1) {
        vSuper->nSize = 0;
      }
      return iVar2;
    }
    __assert_fail("Vec_PtrSize(vSuper) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x451,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                ,0x44d,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

int Aig_ObjCollectSuper( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    int RetValue, i;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // collect the nodes in the implication supergate
    Vec_PtrClear( vSuper );
    RetValue = Aig_ObjCollectSuper_rec( pObj, pObj, vSuper );
    assert( Vec_PtrSize(vSuper) > 1 );
    // unmark the visited nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        Aig_Regular(pObj)->fMarkA = 0;
    // if we found the node and its complement in the same implication supergate, 
    // return empty set of nodes (meaning that we should use constant-0 node)
    if ( RetValue == -1 )
        vSuper->nSize = 0;
    return RetValue;
}